

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stackFrame.c
# Opt level: O1

void sysbvm_stackFrame_printStackTrace(sysbvm_context_t *context,sysbvm_tuple_t stackTrace)

{
  uint uVar1;
  
  if ((stackTrace & 0xf) == 0 && stackTrace != 0) {
    uVar1 = *(uint *)(stackTrace + 0xc) >> 3;
  }
  else {
    uVar1 = 0;
  }
  if (uVar1 == 0) {
    return;
  }
  sysbvm_stackFrame_printStackTrace_cold_1();
  return;
}

Assistant:

SYSBVM_API void sysbvm_stackFrame_printStackTrace(sysbvm_context_t *context, sysbvm_tuple_t stackTrace)
{
    size_t stackTraceSize = sysbvm_array_getSize(stackTrace);
    for(size_t i = 0; i < stackTraceSize; ++i)
    {
        sysbvm_tuple_t stackTraceRecord = sysbvm_array_at(stackTrace, i);
        sysbvm_tuple_t stackTraceRecordString = sysbvm_tuple_asString(context, stackTraceRecord);
        fprintf(stderr, SYSBVM_STRING_PRINTF_FORMAT "\n", SYSBVM_STRING_PRINTF_ARG(stackTraceRecordString));
    }
}